

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbify.cc
# Opt level: O3

void predict_or_learn<false,true>(cbify *data,single_learner *base,example *ec)

{
  wclass *pwVar1;
  wclass *pwVar2;
  size_t sVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  label_t lVar10;
  cb_class *pcVar11;
  label_t lVar12;
  action_score *paVar13;
  action_score *paVar14;
  int iVar15;
  uint32_t uVar16;
  vw_exception *pvVar17;
  wclass *pwVar18;
  wclass *__end1;
  float fVar19;
  uint32_t chosen_action;
  cb_class cl;
  stringstream __msg;
  uint local_234;
  label_t *local_230;
  wclass **local_228;
  wclass *local_220;
  undefined8 local_218;
  float local_210;
  float fStack_20c;
  wclass *local_208;
  size_t sStack_200;
  string local_1f8;
  string local_1d8;
  pointer_____offset_0x10___ *local_1b8;
  float *local_1b0;
  ostream local_1a8;
  
  pwVar1 = (ec->l).cs.costs._begin;
  pwVar2 = (ec->l).cs.costs._end;
  local_208 = (ec->l).cs.costs.end_array;
  sStack_200 = (ec->l).cs.costs.erase_count;
  v_array<CB::cb_class>::clear((v_array<CB::cb_class> *)data);
  lVar10 = (label_t)(data->cb_label).costs._begin;
  pcVar11 = (data->cb_label).costs._end;
  sVar3 = (data->cb_label).costs.erase_count;
  (ec->l).cs.costs.end_array = (wclass *)(data->cb_label).costs.end_array;
  (ec->l).cs.costs.erase_count = sVar3;
  (ec->l).multi = lVar10;
  (ec->l).cs.costs._end = (wclass *)pcVar11;
  uVar4 = *(undefined4 *)((long)&(data->a_s)._begin + 4);
  uVar5 = *(undefined4 *)&(data->a_s)._end;
  uVar6 = *(undefined4 *)((long)&(data->a_s)._end + 4);
  uVar7 = *(undefined4 *)&(data->a_s).end_array;
  uVar8 = *(undefined4 *)((long)&(data->a_s).end_array + 4);
  sVar3 = (data->a_s).erase_count;
  uVar9 = *(undefined4 *)((long)&(data->a_s).erase_count + 4);
  (ec->pred).scalar = *(float *)&(data->a_s)._begin;
  *(undefined4 *)((long)&ec->pred + 4) = uVar4;
  *(undefined4 *)((long)&ec->pred + 8) = uVar5;
  *(undefined4 *)((long)&ec->pred + 0xc) = uVar6;
  *(undefined4 *)((long)&ec->pred + 0x10) = uVar7;
  *(undefined4 *)((long)&ec->pred + 0x14) = uVar8;
  *(int *)((long)&ec->pred + 0x18) = (int)sVar3;
  *(undefined4 *)((long)&ec->pred + 0x1c) = uVar9;
  (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
  sVar3 = data->example_counter;
  data->example_counter = sVar3 + 1;
  local_1b0 = (ec->pred).scalars._begin;
  _local_210 = *(undefined8 *)((long)&ec->pred + 8);
  local_1b8 = &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  local_218 = &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  iVar15 = exploration::sample_after_normalizing<ACTION_SCORE::score_iterator>
                     (sVar3 + data->app_seed,&local_1b8,&local_218,&local_234);
  if (iVar15 != 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>(&local_1a8,"Failed to sample from pdf",0x19);
    pvVar17 = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    VW::vw_exception::vw_exception
              (pvVar17,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/cbify.cc"
               ,0xa4,&local_1d8);
    __cxa_throw(pvVar17,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  uVar16 = local_234 + 1;
  local_218._4_4_ = uVar16;
  local_210 = (ec->pred).a_s._begin[local_234].score;
  if (uVar16 == 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              (&local_1a8,"No action with non-zero probability found!",0x2a);
    pvVar17 = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    VW::vw_exception::vw_exception
              (pvVar17,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/cbify.cc"
               ,0xab,&local_1f8);
    __cxa_throw(pvVar17,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  local_230 = (label_t *)&ec->l;
  local_228 = &(ec->l).cs.costs.end_array;
  fVar19 = 0.0;
  pwVar18 = pwVar1;
  do {
    if (pwVar18 == pwVar2) {
LAB_002077f3:
      local_218._0_4_ = (data->loss1 - data->loss0) * fVar19 + data->loss0;
      local_220 = pwVar1;
      v_array<CB::cb_class>::push_back((v_array<CB::cb_class> *)data,(cb_class *)&local_218);
      lVar10 = (label_t)(data->cb_label).costs._begin;
      lVar12 = (label_t)(data->cb_label).costs._end;
      uVar4 = *(undefined4 *)&(data->cb_label).costs.erase_count;
      uVar5 = *(undefined4 *)((long)&(data->cb_label).costs.erase_count + 4);
      local_230[2] = (label_t)(data->cb_label).costs.end_array;
      local_230[3].label = uVar4;
      local_230[3].weight = (float)uVar5;
      *local_230 = lVar10;
      local_230[1] = lVar12;
      v_array<ACTION_SCORE::action_score>::clear(&data->a_s);
      paVar13 = (action_score *)(ec->pred).scalars._begin;
      paVar14 = (action_score *)(ec->pred).scalars._end;
      sVar3 = (ec->pred).scalars.erase_count;
      (data->a_s).end_array = (action_score *)(ec->pred).scalars.end_array;
      (data->a_s).erase_count = sVar3;
      (data->a_s)._begin = paVar13;
      (data->a_s)._end = paVar14;
      (ec->l).cs.costs._begin = local_220;
      (ec->l).cs.costs._end = pwVar2;
      *local_228 = local_208;
      local_228[1] = (wclass *)sStack_200;
      (ec->pred).multiclass = local_218._4_4_;
      return;
    }
    if (pwVar18->class_index == uVar16) {
      fVar19 = pwVar18->x;
      goto LAB_002077f3;
    }
    pwVar18 = pwVar18 + 1;
  } while( true );
}

Assistant:

void predict_or_learn(cbify& data, single_learner& base, example& ec)
{
  // Store the multiclass or cost-sensitive input label
  MULTICLASS::label_t ld;
  COST_SENSITIVE::label csl;
  if (use_cs)
    csl = ec.l.cs;
  else
    ld = ec.l.multi;

  data.cb_label.costs.clear();
  ec.l.cb = data.cb_label;
  ec.pred.a_s = data.a_s;

  // Call the cb_explore algorithm. It returns a vector of probabilities for each action
  base.predict(ec);
  // data.probs = ec.pred.scalars;

  uint32_t chosen_action;
  if (sample_after_normalizing(
          data.app_seed + data.example_counter++, begin_scores(ec.pred.a_s), end_scores(ec.pred.a_s), chosen_action))
    THROW("Failed to sample from pdf");

  CB::cb_class cl;
  cl.action = chosen_action + 1;
  cl.probability = ec.pred.a_s[chosen_action].score;

  if (!cl.action)
    THROW("No action with non-zero probability found!");
  if (use_cs)
    cl.cost = loss_cs(data, csl.costs, cl.action);
  else
    cl.cost = loss(data, ld.label, cl.action);

  // Create a new cb label
  data.cb_label.costs.push_back(cl);
  ec.l.cb = data.cb_label;

  if (is_learn)
    base.learn(ec);

  data.a_s.clear();
  data.a_s = ec.pred.a_s;

  if (use_cs)
    ec.l.cs = csl;
  else
    ec.l.multi = ld;

  ec.pred.multiclass = cl.action;
}